

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O1

void TTD::SnapShot::DoSnapshotCompare(SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *this;
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *this_00;
  uint uVar1;
  TTD_PTR_ID TVar2;
  uint32 uVar3;
  uint32 uVar4;
  TTDCompareTag TVar5;
  SnapRootInfoEntry *pSVar6;
  SnapContext *pSVar7;
  int *piVar8;
  long *plVar9;
  int *piVar10;
  undefined8 *puVar11;
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *this_01;
  UnorderedArrayListLink *pUVar12;
  UnorderedArrayListLink *pUVar13;
  SnapRootInfoEntry *pSVar14;
  SnapContext *snapCtx2;
  SnapContext *ctx1;
  SnapRootInfoEntry *pSVar15;
  SnapContext *snapCtx1;
  int *piVar16;
  UnorderedArrayListLink *pUVar17;
  SnapContext *pSVar18;
  int *piVar19;
  bool bVar20;
  undefined1 auStack_e8 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap2;
  undefined1 auStack_a8 [8];
  BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  allRootMap1;
  TTDCompareTag ctag;
  uint local_64;
  TTD_PTR_ID local_60;
  TTD_PTR_ID ptrId2;
  SnapShot *local_50;
  SnapRootInfoEntry *local_48;
  TTD_PTR_ID ptrId1;
  SlotArrayInfo *sai1;
  SlotArrayInfo *sai2;
  
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap1->m_rootList)
  ;
  ptrId2 = (TTD_PTR_ID)snap2;
  uVar4 = UnorderedArrayList<TTD::NSSnapValues::SnapRootInfoEntry,_512UL>::Count(&snap2->m_rootList)
  ;
  TTDCompareMap::DiagnosticAssert(compareMap,uVar3 == uVar4);
  auStack_a8 = (undefined1  [8])0x0;
  allRootMap1.buckets = (Type)0x0;
  allRootMap1.entries = (Type)&Memory::HeapAllocator::Instance;
  allRootMap1.alloc = (Type)0x0;
  allRootMap1.size = 0;
  allRootMap1.count = 0;
  allRootMap1.freeList = 0x4b;
  allRootMap1.freeCount = 0;
  allRootMap1.modFunctionIndex = 0;
  auStack_e8 = (undefined1  [8])0x0;
  allRootMap2.buckets = (Type)0x0;
  allRootMap2.entries = (Type)&Memory::HeapAllocator::Instance;
  allRootMap2.alloc = (Type)0x0;
  allRootMap2.size = 0;
  allRootMap2.count = 0;
  allRootMap2.freeList = 0x4b;
  allRootMap2.freeCount = 0;
  allRootMap2.modFunctionIndex = 0;
  pSVar14 = (snap1->m_rootList).m_inlineHeadBlock.CurrPos;
  pSVar15 = (snap1->m_rootList).m_inlineHeadBlock.BlockData;
  local_50 = snap1;
  if (pSVar15 != (SnapRootInfoEntry *)0x0 && pSVar15 != pSVar14) {
    pUVar17 = (snap1->m_rootList).m_inlineHeadBlock.Next;
    do {
      local_48 = pSVar15;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)auStack_a8,&pSVar15->LogId,&local_48);
      pSVar15 = pSVar15 + 1;
      if (pSVar15 == pSVar14) {
        if (pUVar17 == (UnorderedArrayListLink *)0x0) {
          pSVar15 = (SnapRootInfoEntry *)0x0;
        }
        else {
          pSVar14 = pUVar17->CurrPos;
          pSVar15 = pUVar17->BlockData;
          pUVar17 = pUVar17->Next;
        }
      }
    } while (pSVar15 != (SnapRootInfoEntry *)0x0);
  }
  pSVar14 = *(SnapRootInfoEntry **)(ptrId2 + 0x98);
  pSVar15 = *(SnapRootInfoEntry **)(ptrId2 + 0xa8);
  if (pSVar15 != (SnapRootInfoEntry *)0x0 && pSVar15 != pSVar14) {
    puVar11 = *(undefined8 **)(ptrId2 + 0xb0);
    do {
      local_48 = pSVar15;
      JsUtil::
      BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<unsigned_long,TTD::NSSnapValues::SnapRootInfoEntry*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)auStack_e8,&pSVar15->LogId,&local_48);
      pSVar6 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_a8,&local_48->LogId);
      TTDCompareMap::DiagnosticAssert
                (compareMap,pSVar6->MaybeLongLivedRoot == local_48->MaybeLongLivedRoot);
      pSVar6 = JsUtil::
               BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::Item((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       *)auStack_a8,&local_48->LogId);
      TTDCompareMap::CheckConsistentAndAddPtrIdMapping_Root
                (compareMap,pSVar6->LogObject,local_48->LogObject,local_48->LogId);
      pSVar15 = pSVar15 + 1;
      if (pSVar15 == pSVar14) {
        if (puVar11 == (undefined8 *)0x0) {
          pSVar15 = (SnapRootInfoEntry *)0x0;
        }
        else {
          pSVar14 = (SnapRootInfoEntry *)*puVar11;
          pSVar15 = (SnapRootInfoEntry *)puVar11[2];
          puVar11 = (undefined8 *)puVar11[3];
        }
      }
    } while (pSVar15 != (SnapRootInfoEntry *)0x0);
  }
  TVar2 = ptrId2;
  TTDCompareMap::DiagnosticAssert
            (compareMap,local_50->m_activeScriptContext == *(TTD_LOG_PTR_ID *)(ptrId2 + 0x90));
  uVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count(&local_50->m_ctxList);
  uVar4 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Count
                    ((UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL> *)(TVar2 + 0x40));
  TTDCompareMap::DiagnosticAssert(compareMap,uVar3 == uVar4);
  pSVar18 = (local_50->m_ctxList).m_inlineHeadBlock.CurrPos;
  snapCtx1 = (local_50->m_ctxList).m_inlineHeadBlock.BlockData;
  if (snapCtx1 != (SnapContext *)0x0 && snapCtx1 != pSVar18) {
    pUVar12 = (local_50->m_ctxList).m_inlineHeadBlock.Next;
    do {
      pSVar7 = *(SnapContext **)(ptrId2 + 0x40);
      snapCtx2 = *(SnapContext **)(ptrId2 + 0x50);
      if (snapCtx2 != (SnapContext *)0x0 && snapCtx2 != pSVar7) {
        plVar9 = *(long **)(ptrId2 + 0x58);
        do {
          if (snapCtx1->ScriptContextLogId == snapCtx2->ScriptContextLogId) goto LAB_00928156;
          snapCtx2 = snapCtx2 + 1;
          if (snapCtx2 == pSVar7) {
            if (plVar9 == (long *)0x0) {
              snapCtx2 = (SnapContext *)0x0;
            }
            else {
              pSVar7 = (SnapContext *)*plVar9;
              snapCtx2 = (SnapContext *)plVar9[2];
              plVar9 = (long *)plVar9[3];
            }
          }
        } while (snapCtx2 != (SnapContext *)0x0);
      }
      snapCtx2 = (SnapContext *)0x0;
LAB_00928156:
      TTDCompareMap::DiagnosticAssert(compareMap,snapCtx2 != (SnapContext *)0x0);
      NSSnapValues::AssertSnapEquiv
                (snapCtx1,snapCtx2,
                 (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)auStack_a8,
                 (BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)auStack_e8,compareMap);
      snapCtx1 = snapCtx1 + 1;
      if (snapCtx1 == pSVar18) {
        if (pUVar12 == (UnorderedArrayListLink *)0x0) {
          snapCtx1 = (SnapContext *)0x0;
        }
        else {
          pSVar18 = pUVar12->CurrPos;
          snapCtx1 = pUVar12->BlockData;
          pUVar12 = pUVar12->Next;
        }
      }
    } while (snapCtx1 != (SnapContext *)0x0);
  }
  uVar3 = UnorderedArrayList<int,_32UL>::Count(&local_50->m_tcSymbolRegistrationMapContents);
  uVar4 = UnorderedArrayList<int,_32UL>::Count((UnorderedArrayList<int,_32UL> *)(ptrId2 + 0x68));
  TTDCompareMap::DiagnosticAssert(compareMap,uVar3 == uVar4);
  piVar16 = (local_50->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
  piVar19 = (local_50->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData;
  if (piVar19 != (int *)0x0 && piVar19 != piVar16) {
    pUVar13 = (local_50->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
    do {
      piVar8 = *(int **)(ptrId2 + 0x68);
      piVar10 = *(int **)(ptrId2 + 0x78);
      if (*(int **)(ptrId2 + 0x78) == piVar8) {
        piVar10 = (int *)0x0;
      }
      bVar20 = piVar10 != (int *)0x0;
      if ((bVar20) && (*piVar10 != *piVar19)) {
        puVar11 = *(undefined8 **)(ptrId2 + 0x80);
        do {
          piVar10 = piVar10 + 1;
          if (piVar10 == piVar8) {
            if (puVar11 == (undefined8 *)0x0) {
              piVar10 = (int *)0x0;
            }
            else {
              piVar8 = (int *)*puVar11;
              piVar10 = (int *)puVar11[2];
              puVar11 = (undefined8 *)puVar11[3];
            }
          }
          bVar20 = piVar10 != (int *)0x0;
        } while ((bVar20) && (*piVar10 != *piVar19));
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar20);
      piVar19 = piVar19 + 1;
      if (piVar19 == piVar16) {
        if (pUVar13 == (UnorderedArrayListLink *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          piVar16 = pUVar13->CurrPos;
          piVar19 = pUVar13->BlockData;
          pUVar13 = pUVar13->Next;
        }
      }
    } while (piVar19 != (int *)0x0);
  }
  allRootMap1.stats._0_4_ = Done;
  local_48 = (SnapRootInfoEntry *)0x0;
  local_60 = 0;
  TTDCompareMap::GetNextCompareInfo
            (compareMap,(TTDCompareTag *)&allRootMap1.stats,(TTD_PTR_ID *)&local_48,&local_60);
  ctag = Done;
  allRootMap1.stats._4_4_ = 0;
  local_64 = 0;
  do {
    switch((TTDCompareTag)allRootMap1.stats) {
    case Done:
      this = &local_50->m_slotArrayEntries;
      TVar5 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count(this);
      TVar2 = ptrId2;
      uVar1 = allRootMap1.stats._4_4_;
      if (TVar5 < ctag) {
        bVar20 = false;
      }
      else {
        TVar5 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                          ((UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *)
                           (ptrId2 + 0x1b8));
        bVar20 = ctag <= TVar5;
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar20);
      this_00 = &local_50->m_scopeEntries;
      uVar3 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count(this_00)
      ;
      if (uVar3 < uVar1) {
        bVar20 = false;
      }
      else {
        uVar3 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                          ((UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *
                           )(TVar2 + 400));
        bVar20 = uVar1 <= uVar3;
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar20);
      this_01 = &local_50->m_compoundObjectList;
      uVar3 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count(this_01);
      if (uVar3 < local_64) {
        bVar20 = false;
      }
      else {
        uVar3 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                          ((UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *)
                           (TVar2 + 0x160));
        bVar20 = local_64 <= uVar3;
      }
      TTDCompareMap::DiagnosticAssert(compareMap,bVar20);
      uVar3 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count(this);
      uVar4 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Count
                        ((UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL> *)
                         (TVar2 + 0x1b8));
      TTDCompareMap::DiagnosticAssert(compareMap,uVar3 == uVar4);
      uVar3 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count(this_00)
      ;
      uVar4 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Count
                        ((UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL> *)
                         (TVar2 + 400));
      TTDCompareMap::DiagnosticAssert(compareMap,uVar3 == uVar4);
      uVar3 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count(this_01);
      uVar4 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                        ((UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL> *)
                         (TVar2 + 0x160));
      TTDCompareMap::DiagnosticAssert(compareMap,uVar3 == uVar4);
      JsUtil::
      BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)auStack_e8);
      JsUtil::
      BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::~BaseDictionary((BaseDictionary<unsigned_long,_TTD::NSSnapValues::SnapRootInfoEntry_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)auStack_a8);
      return;
    case SlotArray:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,
                 (SlotArrayInfo **)&ptrId1,local_60,&sai1);
      NSSnapValues::AssertSnapEquiv((SlotArrayInfo *)ptrId1,sai1,compareMap);
      ctag = ctag + SlotArray;
      break;
    case FunctionScopeInfo:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,
                 (ScriptFunctionScopeInfo **)&ptrId1,local_60,(ScriptFunctionScopeInfo **)&sai1);
      NSSnapValues::AssertSnapEquiv
                ((ScriptFunctionScopeInfo *)ptrId1,(ScriptFunctionScopeInfo *)sai1,compareMap);
      allRootMap1.stats._4_4_ = allRootMap1.stats._4_4_ + 1;
      break;
    case TopLevelLoadFunction:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,&ptrId1,local_60,
                 (uint64 *)&sai1);
      TTDCompareMap::DiagnosticAssert(compareMap,(SlotArrayInfo *)ptrId1 == sai1);
      break;
    case TopLevelNewFunction:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,&ptrId1,local_60,
                 (uint64 *)&sai1);
      TTDCompareMap::DiagnosticAssert(compareMap,(SlotArrayInfo *)ptrId1 == sai1);
      break;
    case TopLevelEvalFunction:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,&ptrId1,local_60,
                 (uint64 *)&sai1);
      TTDCompareMap::DiagnosticAssert(compareMap,(SlotArrayInfo *)ptrId1 == sai1);
      break;
    case FunctionBody:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,
                 (FunctionBodyResolveInfo **)&ptrId1,local_60,(FunctionBodyResolveInfo **)&sai1);
      NSSnapValues::AssertSnapEquiv
                ((FunctionBodyResolveInfo *)ptrId1,(FunctionBodyResolveInfo *)sai1,compareMap);
      break;
    case SnapObject:
      ptrId1 = 0;
      sai1 = (SlotArrayInfo *)0x0;
      TTDCompareMap::GetCompareValues
                (compareMap,(TTDCompareTag)allRootMap1.stats,(TTD_PTR_ID)local_48,
                 (SnapObject **)&ptrId1,local_60,(SnapObject **)&sai1);
      NSSnapObjects::AssertSnapEquiv((SnapObject *)ptrId1,(SnapObject *)sai1,compareMap);
      local_64 = local_64 + 1;
      break;
    default:
      TTDAbort_unrecoverable_error("Missing tag in case list!!!");
    }
    TTDCompareMap::GetNextCompareInfo
              (compareMap,(TTDCompareTag *)&allRootMap1.stats,(TTD_PTR_ID *)&local_48,&local_60);
  } while( true );
}

Assistant:

void SnapShot::DoSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        //compare the roots to kick things off
        compareMap.DiagnosticAssert(snap1->m_rootList.Count() == snap2->m_rootList.Count());

        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap1(&HeapAllocator::Instance);
        JsUtil::BaseDictionary<TTD_LOG_PTR_ID, NSSnapValues::SnapRootInfoEntry*, HeapAllocator> allRootMap2(&HeapAllocator::Instance);

        for(auto iter1 = snap1->m_rootList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry1 = iter1.Current();
            allRootMap1.AddNew(rootEntry1->LogId, rootEntry1);
        }

        for(auto iter2 = snap2->m_rootList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
        {
            NSSnapValues::SnapRootInfoEntry* rootEntry2 = iter2.Current();
            allRootMap2.AddNew(rootEntry2->LogId, rootEntry2);

            bool ll1 = allRootMap1.Item(rootEntry2->LogId)->MaybeLongLivedRoot;
            compareMap.DiagnosticAssert(ll1 == rootEntry2->MaybeLongLivedRoot);

            TTD_PTR_ID id1 = allRootMap1.Item(rootEntry2->LogId)->LogObject;
            compareMap.CheckConsistentAndAddPtrIdMapping_Root(id1, rootEntry2->LogObject, rootEntry2->LogId);
        }

        //Get the script contexts into the mix
        compareMap.DiagnosticAssert(snap1->m_activeScriptContext == snap2->m_activeScriptContext);
        compareMap.DiagnosticAssert(snap1->m_ctxList.Count() == snap2->m_ctxList.Count());
        for(auto iter1 = snap1->m_ctxList.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx1 = iter1.Current();
            const NSSnapValues::SnapContext* ctx2 = nullptr;
            for(auto iter2 = snap2->m_ctxList.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(ctx1->ScriptContextLogId == iter2.Current()->ScriptContextLogId)
                {
                    ctx2 = iter2.Current();
                    break;
                }
            }
            compareMap.DiagnosticAssert(ctx2 != nullptr);

            NSSnapValues::AssertSnapEquiv(ctx1, ctx2, allRootMap1, allRootMap2, compareMap);
        }

        //compare the contents of the two thread context symbol maps
        compareMap.DiagnosticAssert(snap1->m_tcSymbolRegistrationMapContents.Count() == snap2->m_tcSymbolRegistrationMapContents.Count());
        for(auto iter1 = snap1->m_tcSymbolRegistrationMapContents.GetIterator(); iter1.IsValid(); iter1.MoveNext())
        {
            const Js::PropertyId pid1 = *iter1.Current();
            bool match = false;
            for(auto iter2 = snap2->m_tcSymbolRegistrationMapContents.GetIterator(); iter2.IsValid(); iter2.MoveNext())
            {
                if(*iter2.Current() == pid1)
                {
                    match = true;
                    break;
                }
            }
            compareMap.DiagnosticAssert(match);
        }

        //Iterate on the worklist until we are done
        TTDCompareTag ctag = TTDCompareTag::Done;
        TTD_PTR_ID ptrId1 = TTD_INVALID_PTR_ID;
        TTD_PTR_ID ptrId2 = TTD_INVALID_PTR_ID;

        uint32 comparedSlotArrays = 0;
        uint32 comparedScopes = 0;
        uint32 comparedObjects = 0;

        compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        while(ctag != TTDCompareTag::Done)
        {
            if(ctag == TTDCompareTag::SlotArray)
            {
                const NSSnapValues::SlotArrayInfo* sai1 = nullptr;
                const NSSnapValues::SlotArrayInfo* sai2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &sai1, ptrId2, &sai2);
                NSSnapValues::AssertSnapEquiv(sai1, sai2, compareMap);

                comparedSlotArrays++;
            }
            else if(ctag == TTDCompareTag::FunctionScopeInfo)
            {
                const NSSnapValues::ScriptFunctionScopeInfo* scope1 = nullptr;
                const NSSnapValues::ScriptFunctionScopeInfo* scope2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &scope1, ptrId2, &scope2);
                NSSnapValues::AssertSnapEquiv(scope1, scope2, compareMap);

                comparedScopes++;
            }
            else if(ctag == TTDCompareTag::TopLevelLoadFunction)
            {
                uint64 fload1 = 0;
                uint64 fload2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fload1, ptrId2, &fload2);
                compareMap.DiagnosticAssert(fload1 == fload2);
            }
            else if(ctag == TTDCompareTag::TopLevelNewFunction)
            {
                uint64 fnew1 = 0;
                uint64 fnew2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &fnew1, ptrId2, &fnew2);
                compareMap.DiagnosticAssert(fnew1 == fnew2);
            }
            else if(ctag == TTDCompareTag::TopLevelEvalFunction)
            {
                uint64 feval1 = 0;
                uint64 feval2 = 0;
                compareMap.GetCompareValues(ctag, ptrId1, &feval1, ptrId2, &feval2);
                compareMap.DiagnosticAssert(feval1 == feval2);
            }
            else if(ctag == TTDCompareTag::FunctionBody)
            {
                const NSSnapValues::FunctionBodyResolveInfo* fb1 = nullptr;
                const NSSnapValues::FunctionBodyResolveInfo* fb2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &fb1, ptrId2, &fb2);
                NSSnapValues::AssertSnapEquiv(fb1, fb2, compareMap);
            }
            else if(ctag == TTDCompareTag::SnapObject)
            {
                const NSSnapObjects::SnapObject* obj1 = nullptr;
                const NSSnapObjects::SnapObject* obj2 = nullptr;
                compareMap.GetCompareValues(ctag, ptrId1, &obj1, ptrId2, &obj2);
                NSSnapObjects::AssertSnapEquiv(obj1, obj2, compareMap);

                comparedObjects++;
            }
            else
            {
                TTDAssert(false, "Missing tag in case list!!!");
            }

            compareMap.GetNextCompareInfo(&ctag, &ptrId1, &ptrId2);
        }

        //Make sure all objects/values have been matched -- well not quite since we don't align and treaverse WeakSet values we might not compare everything -- maybe improve later?
        compareMap.DiagnosticAssert(comparedSlotArrays <= snap1->m_slotArrayEntries.Count() && comparedSlotArrays <= snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(comparedScopes <= snap1->m_scopeEntries.Count() && comparedScopes <= snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(comparedObjects <= snap1->m_compoundObjectList.Count() && comparedObjects <= snap2->m_compoundObjectList.Count());

        compareMap.DiagnosticAssert(snap1->m_slotArrayEntries.Count() == snap2->m_slotArrayEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_scopeEntries.Count() == snap2->m_scopeEntries.Count());
        compareMap.DiagnosticAssert(snap1->m_compoundObjectList.Count() == snap2->m_compoundObjectList.Count());

        //
        //TODO: if we missed something we may want to put code here to identify it
        //
    }